

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::Image(Texture *texture,Color *tintColor,Color *borderColor)

{
  Vector2u local_30;
  Vector2<float> local_28;
  Color *local_20;
  Color *borderColor_local;
  Color *tintColor_local;
  Texture *texture_local;
  
  local_20 = borderColor;
  borderColor_local = tintColor;
  tintColor_local = (Color *)texture;
  local_30 = sf::Texture::getSize(texture);
  sf::Vector2<float>::Vector2<unsigned_int>(&local_28,&local_30);
  Image(texture,&local_28,borderColor_local,local_20);
  return;
}

Assistant:

void Image(const sf::Texture& texture, const sf::Color& tintColor, const sf::Color& borderColor) {
    Image(texture, static_cast<sf::Vector2f>(texture.getSize()), tintColor, borderColor);
}